

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-mod-info.cc
# Opt level: O0

void pdfDumpInfoDict(char *fname)

{
  exception *e;
  string local_48;
  QPDF local_18 [8];
  QPDF pdf;
  char *fname_local;
  
  _pdf = fname;
  QPDF::QPDF(local_18);
  QPDF::processFile((char *)local_18,_pdf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,":\t",(allocator<char> *)((long)&e + 7));
  dumpInfoDict(local_18,(ostream *)&std::cout,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
  QPDF::~QPDF(local_18);
  return;
}

Assistant:

void
pdfDumpInfoDict(char const* fname)
{
    try {
        QPDF pdf;
        pdf.processFile(fname);
        dumpInfoDict(pdf);
    } catch (std::exception& e) {
        std::cerr << e.what() << std::endl;
        exit(2);
    }
}